

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O0

void __thiscall ZCC_OpInfoType::FreeAllProtos(ZCC_OpInfoType *this)

{
  ZCC_OpProto *pZVar1;
  ZCC_OpProto *next;
  ZCC_OpProto *proto;
  ZCC_OpInfoType *this_local;
  
  pZVar1 = this->Protos;
  while (next = pZVar1, next != (ZCC_OpProto *)0x0) {
    pZVar1 = next->Next;
    if (next != (ZCC_OpProto *)0x0) {
      operator_delete(next,0x28);
    }
  }
  this->Protos = (ZCC_OpProto *)0x0;
  return;
}

Assistant:

void ZCC_OpInfoType::FreeAllProtos()
{
	for (ZCC_OpProto *proto = Protos, *next = NULL; proto != NULL; proto = next)
	{
		next = proto->Next;
		delete proto;
	}
	Protos = NULL;
}